

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void __thiscall
Test_Template_ExpandTemplate::Test_Template_ExpandTemplate(Test_Template_ExpandTemplate *this)

{
  value_type local_18;
  Test_Template_ExpandTemplate *local_10;
  Test_Template_ExpandTemplate *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(Template, ExpandTemplate) {
  string filename = StringToTemplateFile("  hi {{THERE}}");
  TemplateDictionary dict("test_expand");
  dict.SetValue("THERE", "test");
  string output;
  ASSERT(ExpandTemplate(filename, STRIP_WHITESPACE, &dict, &output));
  ASSERT_STREQ(output.c_str(), "hi test");

  // This will append to output, so we see both together.
  ASSERT(ExpandWithData(filename, DO_NOT_STRIP, &dict, NULL, &output));
  ASSERT_STREQ(output.c_str(), "hi test  hi test");

  ASSERT(!ExpandTemplate(filename + " not found", DO_NOT_STRIP, &dict,
                         &output));
}